

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

bool helics::BrokerFactory::registerBroker(shared_ptr<helics::Broker> *broker,CoreType type)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar5;
  shared_ptr<helics::Broker> local_80;
  shared_ptr<helics::Broker> local_70;
  shared_ptr<helics::Broker> local_60;
  string local_50;
  timespec local_30;
  
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
  }
  else {
    iVar4 = (*peVar1->_vptr_Broker[0xb])();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  }
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar3 = false;
  }
  else {
    local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    bVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                      ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers
                       ,&local_50,&local_60,type);
    if (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  if ((bVar3 == false) &&
     ((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0)) {
    local_30.tv_sec = 0;
    local_30.tv_nsec = 100000000;
    do {
      iVar4 = nanosleep(&local_30,&local_30);
      if (iVar4 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
              ((DelayedDestructor<helics::Broker> *)delayedDestroyer,(milliseconds)0xc8);
    local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    bVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                      ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers
                       ,&local_50,&local_70,type);
    if (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  if (bVar3 != false) {
    local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
              ((DelayedDestructor<helics::Broker> *)delayedDestroyer,&local_80);
    if (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    addExtraTypes(&local_50,type);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool registerBroker(const std::shared_ptr<Broker>& broker, CoreType type)
{
    bool registered = false;
    const std::string& bname = (broker) ? broker->getIdentifier() : std::string{};
    if (broker) {
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if ((!registered) && (broker)) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cleanUpBrokers(std::chrono::milliseconds(200));
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if (registered) {
        delayedDestroyer.addObjectsToBeDestroyed(broker);
        addExtraTypes(bname, type);
    }

    return registered;
}